

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cc
# Opt level: O3

Status __thiscall
google::protobuf::json_internal::anon_unknown_4::
WriteSingular<google::protobuf::json_internal::UnparseProto2Descriptor>
          (anon_unknown_4 *this,JsonWriter *writer,
          Field<google::protobuf::json_internal::UnparseProto2Descriptor> field)

{
  int32_t value;
  anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::Message_*>_3 aVar1;
  bool bVar2;
  uintptr_t extraout_RAX;
  anon_union_8_10_579a0ab3_for_FieldDescriptor_29 aVar3;
  uintptr_t extraout_RAX_00;
  uintptr_t extraout_RAX_01;
  uintptr_t extraout_RAX_02;
  uintptr_t extraout_RAX_03;
  uintptr_t extraout_RAX_04;
  uintptr_t extraout_RAX_05;
  EnumValueDescriptor *pEVar4;
  uintptr_t extraout_RAX_06;
  long lVar5;
  uintptr_t extraout_RAX_07;
  uintptr_t extraout_RAX_08;
  uintptr_t uVar6;
  undefined8 uVar7;
  char *bytes;
  anon_union_8_10_579a0ab3_for_FieldDescriptor_29 *this_00;
  double dVar8;
  undefined1 auVar9 [16];
  string_view str;
  string_view str_00;
  Metadata MVar10;
  StatusOr<long> x;
  StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> x_5;
  anon_union_8_10_579a0ab3_for_FieldDescriptor_29 local_d8;
  anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::Message_*>_3 local_d0;
  EnumDescriptor *local_c8 [4];
  anon_union_8_2_3066aaf9_for_type_descriptor_ local_a8;
  undefined8 local_a0;
  long local_98 [2];
  anon_union_8_10_579a0ab3_for_FieldDescriptor_29 local_88;
  Descriptor *local_80;
  MessageOptions *local_78 [4];
  MessageOptions *local_58;
  Descriptor *pDStack_50;
  anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::Message_*>_3 local_40;
  anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::Message_*>_3 local_38;
  anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::Message_*>_3 local_30;
  EnumDescriptor *local_28;
  
  this_00 = &local_d8;
  switch(field->type_) {
  case '\x01':
    local_d0 = (anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::Message_*>_3)
               (field->field_22).default_value_double_;
    local_d8.default_value_int64_t_ = 1;
    *(undefined8 *)this = 1;
    if ((0x7fefffffffffffff < (ulong)ABS((double)local_d0.data_) &
        (writer->options_).allow_legacy_syntax) == 1) {
      local_d0.data_ = (Message *)0x0;
    }
    JsonWriter::Write(writer,(double)local_d0);
    absl::lts_20240722::internal_statusor::StatusOrData<double>::~StatusOrData
              ((StatusOrData<double> *)&local_d8.default_generated_instance_);
    uVar6 = extraout_RAX_04;
    break;
  case '\x02':
    local_d0._0_4_ = (field->field_22).default_value_float_;
    local_d8.default_value_int64_t_ = 1;
    *(undefined8 *)this = 1;
    if ((0x7f7fffff < (uint)ABS((float)local_d0._0_4_) & (writer->options_).allow_legacy_syntax) ==
        1) {
      local_d0._0_4_ = 0.0;
    }
    JsonWriter::Write(writer,(float)local_d0._0_4_);
    absl::lts_20240722::internal_statusor::StatusOrData<float>::~StatusOrData
              ((StatusOrData<float> *)&local_d8.default_generated_instance_);
    uVar6 = extraout_RAX_05;
    break;
  case '\x03':
  case '\x10':
  case '\x12':
    aVar1 = (anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::Message_*>_3)
            (field->field_22).default_value_int64_t_;
    local_d8.default_value_int64_t_ = 1;
    *(undefined8 *)this = 1;
    local_d0 = aVar1;
    if (((writer->options_).unquote_int64_if_possible == true) &&
       (bVar2 = RoundTripsThroughDouble<long>((long)aVar1), bVar2)) {
      JsonWriter::Write(writer,(int64_t)aVar1);
    }
    else {
      local_38 = aVar1;
      JsonWriter::Write<long>(writer,(Quoted<long> *)&local_38);
    }
    absl::lts_20240722::internal_statusor::StatusOrData<long>::~StatusOrData
              ((StatusOrData<long> *)&local_d8.default_generated_instance_);
    uVar6 = extraout_RAX;
    break;
  case '\x04':
  case '\x06':
    aVar1 = (anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::Message_*>_3)
            (field->field_22).default_value_uint64_t_;
    local_d8.default_value_int64_t_ = 1;
    *(undefined8 *)this = 1;
    local_d0 = aVar1;
    if ((writer->options_).unquote_int64_if_possible == true) {
      auVar9._8_4_ = aVar1._4_4_;
      auVar9._0_8_ = aVar1.data_;
      auVar9._12_4_ = 0x45300000;
      pDStack_50 = (Descriptor *)(auVar9._8_8_ - 1.9342813113834067e+25);
      local_58 = (MessageOptions *)
                 ((double)pDStack_50 +
                 ((double)CONCAT44(0x43300000,aVar1._0_4_) - 4503599627370496.0));
      dVar8 = ldexp(1.0,0x40);
      if (aVar1.data_ !=
          (Message *)
          ((long)((double)local_58 - 9.223372036854776e+18) & (long)(double)local_58 >> 0x3f |
          (long)(double)local_58) || dVar8 <= (double)local_58) goto LAB_002cc883;
      JsonWriter::Write(writer,(uint64_t)aVar1);
    }
    else {
LAB_002cc883:
      local_40 = aVar1;
      JsonWriter::Write<unsigned_long>(writer,(Quoted<unsigned_long> *)&local_40);
    }
    absl::lts_20240722::internal_statusor::StatusOrData<unsigned_long>::~StatusOrData
              ((StatusOrData<unsigned_long> *)&local_d8.default_generated_instance_);
    uVar6 = extraout_RAX_02;
    break;
  case '\x05':
  case '\x0f':
  case '\x11':
    local_d0._0_4_ = (field->field_22).default_value_int32_t_;
    local_d8.default_value_int64_t_ = 1;
    *(undefined8 *)this = 1;
    JsonWriter::Write(writer,local_d0._0_4_);
    goto LAB_002cca29;
  case '\a':
  case '\r':
    local_d0._0_4_ = (field->field_22).default_value_uint32_t_;
    local_d8.default_value_int64_t_ = 1;
    *(undefined8 *)this = 1;
    JsonWriter::Write(writer,local_d0._0_4_);
    absl::lts_20240722::internal_statusor::StatusOrData<unsigned_int>::~StatusOrData
              ((StatusOrData<unsigned_int> *)&local_d8.default_generated_instance_);
    uVar6 = extraout_RAX_01;
    break;
  case '\b':
    bVar2 = (field->field_22).default_value_bool_;
    local_d0._0_1_ = bVar2;
    local_d8.default_value_int64_t_ = 1;
    *(undefined8 *)this = 1;
    bytes = "false";
    if ((ulong)bVar2 != 0) {
      bytes = "true";
    }
    io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,bytes,(ulong)bVar2 ^ 5);
    absl::lts_20240722::internal_statusor::StatusOrData<bool>::~StatusOrData
              ((StatusOrData<bool> *)&local_d8.default_generated_instance_);
    uVar6 = extraout_RAX_03;
    break;
  case '\t':
    local_c8[0] = (EnumDescriptor *)(((field->field_22).default_value_string_)->_M_dataplus)._M_p;
    local_d0 = (anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::Message_*>_3)
               ((field->field_22).default_value_string_)->_M_string_length;
    local_d8.default_value_int64_t_ = 1;
    *(undefined8 *)this = 1;
    local_30 = local_d0;
    local_28 = local_c8[0];
    JsonWriter::Write<std::basic_string_view<char,std::char_traits<char>>>
              (writer,(Quoted<std::basic_string_view<char,_std::char_traits<char>_>_> *)&local_30);
    goto LAB_002ccaee;
  case '\n':
  case '\v':
    UnparseProto2Descriptor::GetMessage((Field)&local_d8.default_generated_instance_);
    *(anon_union_8_10_579a0ab3_for_FieldDescriptor_29 *)this = local_d8;
    aVar3 = local_d8;
    if ((local_d8.default_value_uint64_t_ & 1) == 0) {
      LOCK();
      *(int *)local_d8.default_value_enum_ = *(int *)local_d8.default_value_enum_ + 1;
      UNLOCK();
      aVar3.default_generated_instance_._M_b._M_p =
           *(atomic<const_google::protobuf::Message_*> *)this;
    }
    if (aVar3 == (EnumDescriptor **)0x1) {
      if (local_d8 != (EnumDescriptor **)0x1) {
        uVar7 = absl::lts_20240722::internal_statusor::Helper::Crash
                          ((Status *)&local_d8.default_generated_instance_);
        if (local_d8 != local_c8) {
          operator_delete(local_d8.default_value_enum_,(ulong)&local_c8[0]->field_0x1);
        }
        absl::lts_20240722::internal_statusor::
        StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>::~StatusOrData
                  ((StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                   &local_88.default_generated_instance_);
        _Unwind_Resume(uVar7);
      }
      MVar10 = Message::GetMetadata(local_d0.data_);
      WriteMessage<google::protobuf::json_internal::UnparseProto2Descriptor>
                (this,writer,local_d0.data_,MVar10.descriptor,false);
    }
    absl::lts_20240722::internal_statusor::StatusOrData<const_google::protobuf::Message_*>::
    ~StatusOrData((StatusOrData<const_google::protobuf::Message_*> *)
                  &local_d8.default_generated_instance_);
    return (Status)extraout_RAX_00;
  case '\f':
    local_78[0] = (MessageOptions *)(((field->field_22).default_value_string_)->_M_dataplus)._M_p;
    local_80 = (Descriptor *)((field->field_22).default_value_string_)->_M_string_length;
    local_88.default_value_int64_t_ = 1;
    *(undefined8 *)this = 1;
    if ((writer->options_).allow_legacy_syntax == true) {
      absl::lts_20240722::CEscape_abi_cxx11_(&local_d8);
      str._M_str = (char *)local_d8.default_value_int64_t_;
      str._M_len = (size_t)local_d0.data_;
      JsonWriter::WriteBase64(writer,str);
      if (local_d8 != local_c8) {
        operator_delete(local_d8.default_value_enum_,(ulong)&local_c8[0]->field_0x1);
      }
    }
    else {
      str_00._M_str = (char *)local_78[0];
      str_00._M_len = (size_t)local_80;
      JsonWriter::WriteBase64(writer,str_00);
    }
    this_00 = &local_88;
LAB_002ccaee:
    absl::lts_20240722::internal_statusor::
    StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>::~StatusOrData
              ((StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_> *)
               &this_00->default_generated_instance_);
    uVar6 = extraout_RAX_08;
    break;
  case '\x0e':
    pEVar4 = FieldDescriptor::default_value_enum(field);
    value = pEVar4->number_;
    local_d0._0_4_ = value;
    local_d8.default_value_int64_t_ = 1;
    *(undefined8 *)this = 1;
    WriteEnum<google::protobuf::json_internal::UnparseProto2Descriptor>
              (writer,field,value,kUnquoted);
LAB_002cca29:
    absl::lts_20240722::internal_statusor::StatusOrData<int>::~StatusOrData
              ((StatusOrData<int> *)&local_d8.default_generated_instance_);
    uVar6 = extraout_RAX_06;
    break;
  default:
    local_d8.default_value_int64_t_ = 0x18;
    local_d0.data_ = (Message *)0x3d8279;
    lVar5 = absl::lts_20240722::numbers_internal::FastIntToBuffer
                      ((uint)field->type_,(char *)local_78);
    local_88.default_value_enum_ = (EnumValueDescriptor *)(lVar5 - (long)local_78);
    local_80 = (Descriptor *)local_78;
    absl::lts_20240722::StrCat_abi_cxx11_
              ((AlphaNum *)&local_a8,(AlphaNum *)&local_d8.default_generated_instance_);
    absl::lts_20240722::InvalidArgumentError(this,local_a0,local_a8.message_type);
    if (local_a8.message_type == (Descriptor *)local_98) {
      return (Status)(uintptr_t)local_98;
    }
    operator_delete(local_a8.message_type,local_98[0] + 1);
    return (Status)extraout_RAX_07;
  }
  *(undefined8 *)this = 1;
  return (Status)uVar6;
}

Assistant:

absl::Status WriteSingular(JsonWriter& writer, Field<Traits> field,
                           Args&&... args) {
  // When the pack `args` is empty, the caller has requested printing the
  // default value.
  bool is_default = sizeof...(Args) == 0;
  switch (Traits::FieldType(field)) {
    case FieldDescriptor::TYPE_FLOAT: {
      auto x = Traits::GetFloat(field, std::forward<Args>(args)...);
      RETURN_IF_ERROR(x.status());
      if (writer.options().allow_legacy_syntax && is_default &&
          !std::isfinite(*x)) {
        *x = 0;
      }
      writer.Write(*x);
      break;
    }
    case FieldDescriptor::TYPE_DOUBLE: {
      auto x = Traits::GetDouble(field, std::forward<Args>(args)...);
      RETURN_IF_ERROR(x.status());
      if (writer.options().allow_legacy_syntax && is_default &&
          !std::isfinite(*x)) {
        *x = 0;
      }
      writer.Write(*x);
      break;
    }
    case FieldDescriptor::TYPE_SFIXED64:
    case FieldDescriptor::TYPE_SINT64:
    case FieldDescriptor::TYPE_INT64: {
      auto x = Traits::GetInt64(field, std::forward<Args>(args)...);
      RETURN_IF_ERROR(x.status());
      if (writer.options().unquote_int64_if_possible &&
          RoundTripsThroughDouble(*x)) {
        writer.Write(*x);
      } else {
        writer.Write(MakeQuoted(*x));
      }
      break;
    }
    case FieldDescriptor::TYPE_FIXED64:
    case FieldDescriptor::TYPE_UINT64: {
      auto x = Traits::GetUInt64(field, std::forward<Args>(args)...);
      RETURN_IF_ERROR(x.status());
      if (writer.options().unquote_int64_if_possible &&
          RoundTripsThroughDouble(*x)) {
        writer.Write(*x);
      } else {
        writer.Write(MakeQuoted(*x));
      }
      break;
    }
    case FieldDescriptor::TYPE_SFIXED32:
    case FieldDescriptor::TYPE_SINT32:
    case FieldDescriptor::TYPE_INT32: {
      auto x = Traits::GetInt32(field, std::forward<Args>(args)...);
      RETURN_IF_ERROR(x.status());
      writer.Write(*x);
      break;
    }
    case FieldDescriptor::TYPE_FIXED32:
    case FieldDescriptor::TYPE_UINT32: {
      auto x = Traits::GetUInt32(field, std::forward<Args>(args)...);
      RETURN_IF_ERROR(x.status());
      writer.Write(*x);
      break;
    }
    case FieldDescriptor::TYPE_BOOL: {
      auto x = Traits::GetBool(field, std::forward<Args>(args)...);
      RETURN_IF_ERROR(x.status());
      writer.Write(*x ? "true" : "false");
      break;
    }
    case FieldDescriptor::TYPE_STRING: {
      auto x = Traits::GetString(field, writer.ScratchBuf(),
                                 std::forward<Args>(args)...);
      RETURN_IF_ERROR(x.status());
      writer.Write(MakeQuoted(*x));
      break;
    }
    case FieldDescriptor::TYPE_BYTES: {
      auto x = Traits::GetString(field, writer.ScratchBuf(),
                                 std::forward<Args>(args)...);
      RETURN_IF_ERROR(x.status());
      if (writer.options().allow_legacy_syntax && is_default) {
        // Although difficult to verify, it appears that the original ESF parser
        // fails to unescape the contents of a
        // google.protobuf.Field.default_value, which may potentially be
        // escaped if it is for a `bytes` field (note that default_value is a
        // `string` regardless of what type the field is).
        //
        // However, our parser's type.proto guts actually know to do this
        // correctly, so this bug must be manually re-introduced.
        writer.WriteBase64(absl::CEscape(*x));
      } else {
        writer.WriteBase64(*x);
      }
      break;
    }
    case FieldDescriptor::TYPE_ENUM: {
      auto x = Traits::GetEnumValue(field, std::forward<Args>(args)...);
      RETURN_IF_ERROR(x.status());
      WriteEnum<Traits>(writer, field, *x);
      break;
    }
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_GROUP: {
      auto x = Traits::GetMessage(field, std::forward<Args>(args)...);
      RETURN_IF_ERROR(x.status());
      return WriteMessage<Traits>(writer, **x, Traits::GetDesc(**x));
    }
    default:
      return absl::InvalidArgumentError(
          absl::StrCat("unsupported field type: ", Traits::FieldType(field)));
  }

  return absl::OkStatus();
}